

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix::SwapColumns(Matrix *this,int first_column,int second_column)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  int local_28;
  int row;
  int result;
  int second_column_local;
  int first_column_local;
  Matrix *this_local;
  
  if (first_column == second_column) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = false;
    for (local_28 = 0; local_28 < this->n_; local_28 = local_28 + 1) {
      pvVar2 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)local_28);
      pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                         (pvVar2,(long)first_column);
      pvVar2 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)local_28);
      pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                         (pvVar2,(long)second_column);
      bVar1 = operator!=(pvVar3,pvVar4);
      if (bVar1) {
        this_local._7_1_ = true;
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)local_28);
        pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                           (pvVar2,(long)first_column);
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)local_28);
        pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                           (pvVar2,(long)second_column);
        std::swap<Fraction>(pvVar3,pvVar4);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Matrix::SwapColumns(int first_column, int second_column) {
  if (first_column == second_column) {
    return false;
  }

  int result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][first_column] != elements_[row][second_column]) {
      result = true;
      std::swap(elements_[row][first_column], elements_[row][second_column]);
    }
  }

  return result;
}